

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::initNgrams(Dictionary *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000038;
  vector<int,_std::allocator<int>_> *in_stack_00000040;
  string word;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_30 [32];
  ulong local_10;
  
  for (local_10 = 0; local_10 < (ulong)(long)*(int *)((long)&in_RDI[2].field_2 + 8);
      local_10 = local_10 + 1) {
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
              ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
               &in_RDI[1]._M_string_length,local_10);
    __rhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffb0;
    std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::operator+(in_RDI,__rhs_00);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &in_RDI[1]._M_string_length;
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
              ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)__rhs,local_10);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x187f04);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
              ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)__rhs,local_10);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)__rhs_00,(value_type_conflict1 *)__rhs);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
              ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
               &in_RDI[1]._M_string_length,local_10);
    bVar1 = std::operator!=(__rhs_00,__rhs);
    if (bVar1) {
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
                 &in_RDI[1]._M_string_length,local_10);
      computeSubwords((Dictionary *)word._M_string_length,(string *)word._0_8_,in_stack_00000040,
                      in_stack_00000038);
    }
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void Dictionary::initNgrams() {
  for (size_t i = 0; i < size_; i++) {
    std::string word = BOW + words_[i].word + EOW;
    words_[i].subwords.clear();
    words_[i].subwords.push_back(i);
    if (words_[i].word != EOS) {
      computeSubwords(word, words_[i].subwords);
    }
  }
}